

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcc_string.c
# Opt level: O2

char gstr_cmp(char *a,char *b)

{
  char cVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    cVar1 = a[lVar2];
    if ((cVar1 == '\0') || (cVar1 != b[lVar2])) break;
    lVar2 = lVar2 + 1;
  }
  return cVar1 == b[lVar2];
}

Assistant:

char gstr_cmp(const char *a,const char *b)
{
	while(*a==*b && *a)
		++a,++b;
	if(*a==*b)
		return 1;
	else
		return 0;
}